

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall kratos::DependencyVisitor::visit(DependencyVisitor *this,Generator *generator)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 local_60 [24];
  pointer local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::AssignStmt> assign;
  
  lVar2 = (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 4;
    lVar3 = 0;
    do {
      Generator::get_stmt((Generator *)local_60,(uint32_t)generator);
      iVar1 = *(int *)(local_60._0_8_ + 0x78);
      if (iVar1 == 5) {
        Stmt::as<kratos::ModuleInstantiationStmt>((Stmt *)local_40);
        visit_module_instantiation(this,(ModuleInstantiationStmt *)local_40);
LAB_001fb5ea:
        if (assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      else {
        if (iVar1 == 4) {
          Stmt::as<kratos::StmtBlock>((Stmt *)local_40);
          iVar1 = *(int *)&(((optional<kratos::EventControl> *)
                            &(((InstantiationStmt *)((long)local_40 + 0xc0))->port_mapping_)._M_t.
                             _M_impl.super__Rb_tree_header._M_header._M_parent)->
                           super__Optional_base<kratos::EventControl,_true,_true>)._M_payload.
                           super__Optional_payload_base<kratos::EventControl>._M_payload;
          if (iVar1 == 0) {
            Stmt::as<kratos::CombinationalStmtBlock>((Stmt *)(local_60 + 0x10));
            visit_block(this,(CombinationalStmtBlock *)local_60._16_8_);
          }
          else {
            if (iVar1 != 1) goto LAB_001fb5ea;
            Stmt::as<kratos::SequentialStmtBlock>((Stmt *)(local_60 + 0x10));
            visit_block(this,(SequentialStmtBlock *)local_60._16_8_);
          }
          if (local_48 != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
          }
          goto LAB_001fb5ea;
        }
        if (iVar1 == 3) {
          Stmt::as<kratos::AssignStmt>((Stmt *)local_40);
          visit_assign(this,(AssignStmt *)local_40);
          goto LAB_001fb5ea;
        }
      }
      if ((pointer)local_60._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return;
}

Assistant:

void visit(Generator *generator) override {
        // visit the top and find out top level assignments
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto const &stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign = stmt->as<AssignStmt>();
                visit_assign(assign.get());
            } else if (stmt->type() == StatementType::Block) {
                auto block = stmt->as<StmtBlock>();
                if (block->block_type() == StatementBlockType::Sequential) {
                    visit_block(block->as<SequentialStmtBlock>().get());
                } else if (block->block_type() == StatementBlockType::Combinational) {
                    visit_block(block->as<CombinationalStmtBlock>().get());
                }
            } else if (stmt->type() == StatementType::ModuleInstantiation) {
                visit_module_instantiation(stmt->as<ModuleInstantiationStmt>().get());
            }
        }
    }